

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O1

int __thiscall
CVmObjDate::getp_findWeekday(CVmObjDate *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  int32_t *piVar1;
  int iVar2;
  uint uVar3;
  vm_obj_id_t vVar4;
  int iVar5;
  uint uVar6;
  uint argc;
  int32_t daytime;
  int32_t dayno;
  caldate_t cd;
  int32_t local_50;
  int32_t local_4c;
  CVmTimeZone *local_48;
  caldate_t local_3c;
  
  if (oargc == (uint *)0x0) {
    argc = 0;
  }
  else {
    argc = *oargc;
  }
  if (getp_findWeekday(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_findWeekday();
  }
  iVar2 = CVmObject::get_prop_check_argc(retval,oargc,&getp_findWeekday::desc);
  if (iVar2 == 0) {
    if (sp_[-1].typ == VM_INT) {
      vVar4 = sp_[-1].val.obj;
    }
    else {
      vVar4 = vm_val_t::nonint_num_to_int(sp_ + -1);
    }
    if (sp_[-2].typ == VM_INT) {
      uVar3 = sp_[-2].val.intval;
    }
    else {
      uVar3 = vm_val_t::nonint_num_to_int(sp_ + -2);
    }
    if ((vVar4 - 8 < 0xfffffff9) || (uVar3 == 0)) {
      err_throw(0x902);
    }
    local_48 = get_tz_arg(2,argc);
    piVar1 = (int32_t *)(this->super_CVmObject).ext_;
    local_4c = *piVar1;
    local_50 = piVar1[1];
    CVmTimeZone::utc_to_local(local_48,&local_4c,&local_50,&local_3c.y);
    caldate_t::set_dayno(&local_3c,local_4c);
    local_3c.y = local_3c.y - (uint)((long)local_3c.m < 3);
    iVar2 = local_3c.y + 3;
    if (-1 < local_3c.y) {
      iVar2 = local_3c.y;
    }
    iVar5 = (int)((ulong)((long)local_3c.y * -0x51eb851f) >> 0x20);
    iVar2 = local_3c.y + local_3c.d + *(int *)(&DAT_002ca35c + (long)local_3c.m * 4) + (iVar2 >> 2)
            + ((iVar5 >> 5) - (iVar5 >> 0x1f)) + local_3c.y / 400;
    iVar2 = (iVar2 / 7) * 7 - iVar2;
    iVar5 = iVar2 + vVar4;
    iVar2 = (int)((ulong)((long)(int)(vVar4 + iVar2 + 6) * -0x6db6db6d) >> 0x20) + iVar5 + 6;
    iVar2 = ((iVar2 >> 2) - (iVar2 >> 0x1f)) * -7 + iVar5 + 6;
    if ((int)uVar3 < 1) {
      uVar6 = 7 - iVar2;
      iVar2 = ((uVar6 / 7) * 7 - uVar6) + ~uVar3 * -7;
    }
    else {
      iVar2 = iVar2 + uVar3 * 7 + -7;
    }
    local_4c = iVar2 + local_4c;
    local_50 = 0;
    CVmTimeZone::local_to_utc(local_48,&local_4c,&local_50);
    vVar4 = create(0,local_4c,local_50);
    retval->typ = VM_OBJ;
    (retval->val).obj = vVar4;
    sp_ = sp_ + -(long)(int)argc;
  }
  return 1;
}

Assistant:

int CVmObjDate::getp_findWeekday(VMG_ vm_obj_id_t self,
                                 vm_val_t *retval, uint *oargc)
{
    /* check arguments */
    uint argc = (oargc != 0 ? *oargc : 0);
    static CVmNativeCodeDesc desc(2, 1);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* get the day of week and 'which' arguments */
    int32_t wday = G_stk->get(0)->num_to_int(vmg0_);
    int32_t which = G_stk->get(1)->num_to_int(vmg0_);

    /* check the weekday and 'which' ranges */
    if (wday < 1 || wday > 7 || which == 0)
        err_throw(VMERR_BAD_VAL_BIF);

    /* adjust wday to 0=Sunday */
    wday -= 1;

    /* get my date in local time */
    CVmTimeZone *tz = get_tz_arg(vmg_ 2, argc);
    int32_t dayno = get_local_date(tz);

    /* figure my weekday */
    caldate_t cd(dayno);
    int my_wday = cd.weekday();

    /* figure the difference between the target day and my day, mod 7 */
    int delta = (7 + wday - my_wday) % 7;

    /* 
     *   Go forward that many days, or backwards (7 - delta), to get the
     *   first occurrence before/after my date.  Then go forwards or
     *   backwards by additional weeks as needed.
     */
    if (which > 0)
        dayno += delta + (which-1)*7;
    else
        dayno -= ((7 - delta) % 7) + (-which-1)*7;

    /* return a new date at midnight on the given day */
    int32_t daytime = 0;
    tz->local_to_utc(dayno, daytime);
    retval->set_obj(create(vmg_ FALSE, dayno, daytime));

    /* discard arguments */
    G_stk->discard(argc);

    /* handled */
    return TRUE;
}